

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathDistinctSorted(xmlNodeSetPtr nodes)

{
  int size;
  int iVar1;
  xmlNodeSetPtr cur;
  xmlHashTablePtr hash;
  xmlChar *key;
  void *pvVar2;
  long lVar3;
  xmlNodePtr cur_00;
  
  if (((nodes != (xmlNodeSetPtr)0x0) && (nodes->nodeNr != 0)) &&
     (nodes->nodeTab != (xmlNodePtr *)0x0)) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
    }
    if (cur == (xmlNodeSetPtr)0x0) {
LAB_001bdc45:
      nodes = (xmlNodeSetPtr)0x0;
    }
    else {
      size = nodes->nodeNr;
      hash = xmlHashCreate(size);
      if (0 < (long)size) {
        lVar3 = 0;
        do {
          if (lVar3 < nodes->nodeNr) {
            cur_00 = nodes->nodeTab[lVar3];
          }
          else {
            cur_00 = (xmlNode *)0x0;
          }
          key = xmlNodeGetContent(cur_00);
          pvVar2 = xmlHashLookup(hash,key);
          if (pvVar2 == (void *)0x0) {
            iVar1 = xmlHashAddEntry(hash,key,key);
            if (iVar1 < 0) {
              (*xmlFree)(key);
            }
            else {
              iVar1 = xmlXPathNodeSetAddUnique(cur,cur_00);
              if (-1 < iVar1) goto LAB_001bdc05;
            }
            xmlHashFree(hash,xmlHashDefaultDeallocator);
            xmlXPathFreeNodeSet(cur);
            goto LAB_001bdc45;
          }
          (*xmlFree)(key);
LAB_001bdc05:
          lVar3 = lVar3 + 1;
        } while (size != lVar3);
      }
      xmlHashFree(hash,xmlHashDefaultDeallocator);
      nodes = cur;
    }
  }
  return nodes;
}

Assistant:

xmlNodeSetPtr
xmlXPathDistinctSorted (xmlNodeSetPtr nodes) {
    xmlNodeSetPtr ret;
    xmlHashTablePtr hash;
    int i, l;
    xmlChar * strval;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes))
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    l = xmlXPathNodeSetGetLength(nodes);
    hash = xmlHashCreate (l);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	strval = xmlXPathCastNodeToString(cur);
	if (xmlHashLookup(hash, strval) == NULL) {
	    if (xmlHashAddEntry(hash, strval, strval) < 0) {
                xmlFree(strval);
                goto error;
            }
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        goto error;
	} else {
	    xmlFree(strval);
	}
    }
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    return(ret);

error:
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    xmlXPathFreeNodeSet(ret);
    return(NULL);
}